

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

void touch_file(char *name)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  int extraout_EDX;
  ulong unaff_RBX;
  long lVar7;
  uv_loop_t **__s1;
  long *plVar8;
  uv_fs_event_t *puVar9;
  undefined1 *unaff_R14;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  uv_fs_t req;
  char acStack_9f0 [24];
  char *apcStack_9d8 [15];
  undefined1 auStack_960 [104];
  undefined8 uStack_8f8;
  uv_fs_event_t *puStack_8f0;
  long lStack_8e8;
  long lStack_8e0;
  code *pcStack_8d8;
  long lStack_8d0;
  long lStack_8c8;
  code *pcStack_8c0;
  size_t sStack_8b0;
  size_t sStack_8a8;
  size_t sStack_8a0;
  char acStack_898 [1032];
  undefined8 uStack_490;
  uv_fs_event_t uStack_440;
  undefined1 auStack_3c8 [104];
  undefined8 uStack_360;
  code *pcStack_358;
  undefined8 uStack_348;
  code *pcStack_340;
  long lStack_338;
  long lStack_330;
  code *pcStack_328;
  long lStack_320;
  long lStack_318;
  code *pcStack_310;
  long lStack_308;
  long lStack_300;
  code *pcStack_2f8;
  undefined8 uStack_2e8;
  long lStack_2e0;
  undefined8 uStack_2d8;
  code *pcStack_2d0;
  long lStack_2c0;
  long lStack_2b8;
  undefined1 auStack_2b0 [120];
  code *pcStack_238;
  long lStack_228;
  long lStack_220;
  ulong uStack_218;
  code *pcStack_210;
  undefined8 local_208;
  long local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [88];
  uint local_180;
  
  iVar3 = 2;
  pcStack_210 = (code *)0x188c7e;
  iVar2 = uv_fs_open(0,local_1d8,name,2,0,0);
  local_1e8._0_8_ = SEXT48(iVar2);
  local_1f8 = 0;
  if (local_1e8._0_8_ == 0) {
    unaff_R14 = local_1d8;
    unaff_RBX = (ulong)local_180;
    pcStack_210 = (code *)0x188caf;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_210 = (code *)0x188cc0;
    local_1e8 = uv_buf_init("foo",4);
    puVar6 = local_1e8;
    local_208 = 0;
    pcStack_210 = (code *)0x188cec;
    iVar2 = uv_fs_write(0,unaff_R14,unaff_RBX,puVar6,1,0xffffffffffffffff);
    iVar3 = (int)puVar6;
    local_1f8 = (long)iVar2;
    local_1f0 = 0;
    if (local_1f8 < 0) goto LAB_00188d61;
    unaff_R14 = local_1d8;
    pcStack_210 = (code *)0x188d11;
    uv_fs_req_cleanup(unaff_R14);
    iVar3 = 0;
    pcStack_210 = (code *)0x188d1f;
    iVar2 = uv_fs_close(0,unaff_R14,local_180);
    local_1f8 = (long)iVar2;
    local_1f0 = 0;
    if (local_1f8 == 0) {
      pcStack_210 = (code *)0x188d45;
      uv_fs_req_cleanup(local_1d8);
      return;
    }
  }
  else {
    pcStack_210 = (code *)0x188d61;
    touch_file_cold_1();
LAB_00188d61:
    pcStack_210 = (code *)0x188d70;
    touch_file_cold_3();
  }
  pcStack_210 = run_test_fs_event_no_callback_on_close;
  touch_file_cold_2();
  pcStack_238 = (code *)0x188d8b;
  uStack_218 = unaff_RBX;
  pcStack_210 = (code *)unaff_R14;
  uVar4 = uv_default_loop();
  pcStack_238 = (code *)0x188d9d;
  remove("watch_dir/file1");
  pcStack_238 = (code *)0x188da9;
  remove("watch_dir/");
  pcStack_238 = (code *)0x188db5;
  create_dir("watch_dir");
  pcStack_238 = (code *)0x188dbd;
  create_file("watch_dir/file1");
  pcStack_238 = (code *)0x188dcc;
  iVar2 = uv_fs_event_init(uVar4,&fs_event);
  lStack_220 = (long)iVar2;
  lStack_228 = 0;
  if (lStack_220 == 0) {
    iVar3 = 0;
    pcStack_238 = (code *)0x188e08;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file1");
    lStack_220 = (long)iVar2;
    lStack_228 = 0;
    if (lStack_220 != 0) goto LAB_00188f04;
    pcStack_238 = (code *)0x188e3b;
    uv_close(&fs_event,close_cb);
    pcStack_238 = (code *)0x188e45;
    uv_run(uVar4,0);
    lStack_220 = (long)fs_event_cb_called;
    lStack_228 = 0;
    if (lStack_220 != 0) goto LAB_00188f13;
    lStack_220 = 1;
    lStack_228 = (long)close_cb_called;
    if (lStack_228 != 1) goto LAB_00188f22;
    pcStack_238 = (code *)0x188e9b;
    remove("watch_dir/file1");
    pcStack_238 = (code *)0x188ea7;
    remove("watch_dir/");
    pcStack_238 = (code *)0x188eb8;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_238 = (code *)0x188ec2;
    uv_run(uVar4,0);
    lStack_220 = 0;
    pcStack_238 = (code *)0x188ed3;
    iVar2 = uv_loop_close(uVar4);
    lStack_228 = (long)iVar2;
    if (lStack_220 == lStack_228) {
      pcStack_238 = (code *)0x188eeb;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_238 = (code *)0x188f04;
    run_test_fs_event_no_callback_on_close_cold_1();
LAB_00188f04:
    pcStack_238 = (code *)0x188f13;
    run_test_fs_event_no_callback_on_close_cold_2();
LAB_00188f13:
    pcStack_238 = (code *)0x188f22;
    run_test_fs_event_no_callback_on_close_cold_3();
LAB_00188f22:
    pcStack_238 = (code *)0x188f31;
    run_test_fs_event_no_callback_on_close_cold_4();
  }
  pcStack_238 = run_test_fs_event_immediate_close;
  run_test_fs_event_no_callback_on_close_cold_5();
  pcStack_2d0 = (code *)0x188f4d;
  pcStack_238 = (code *)uVar4;
  uVar4 = uv_default_loop();
  pcStack_2d0 = (code *)0x188f5d;
  iVar2 = uv_timer_init(uVar4,auStack_2b0);
  lStack_2b8 = (long)iVar2;
  lStack_2c0 = 0;
  if (lStack_2b8 == 0) {
    iVar3 = 0;
    pcStack_2d0 = (code *)0x188f95;
    iVar2 = uv_timer_start(auStack_2b0,timer_cb,1);
    lStack_2b8 = (long)iVar2;
    lStack_2c0 = 0;
    if (lStack_2b8 != 0) goto LAB_0018903e;
    pcStack_2d0 = (code *)0x188fbf;
    uv_run(uVar4,0);
    lStack_2b8 = 2;
    lStack_2c0 = (long)close_cb_called;
    if (lStack_2c0 != 2) goto LAB_0018904d;
    pcStack_2d0 = (code *)0x188ff1;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_2d0 = (code *)0x188ffb;
    uv_run(uVar4,0);
    lStack_2b8 = 0;
    pcStack_2d0 = (code *)0x18900c;
    iVar2 = uv_loop_close(uVar4);
    lStack_2c0 = (long)iVar2;
    if (lStack_2b8 == lStack_2c0) {
      pcStack_2d0 = (code *)0x189024;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_2d0 = (code *)0x18903e;
    run_test_fs_event_immediate_close_cold_1();
LAB_0018903e:
    pcStack_2d0 = (code *)0x18904d;
    run_test_fs_event_immediate_close_cold_2();
LAB_0018904d:
    pcStack_2d0 = (code *)0x18905c;
    run_test_fs_event_immediate_close_cold_3();
  }
  plVar8 = &lStack_2b8;
  pcStack_2d0 = timer_cb;
  run_test_fs_event_immediate_close_cold_4();
  pcStack_2d0 = (code *)0x1e8b0e;
  pcStack_2f8 = (code *)0x189085;
  uStack_2d8 = uVar4;
  iVar2 = uv_fs_event_init(plVar8[1],&fs_event);
  lStack_2e0 = (long)iVar2;
  uStack_2e8 = 0;
  if (lStack_2e0 == 0) {
    iVar3 = 0;
    pcStack_2f8 = (code *)0x1890bd;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,".");
    lStack_2e0 = (long)iVar2;
    uStack_2e8 = 0;
    if (lStack_2e0 == 0) {
      pcStack_2f8 = (code *)0x1890ef;
      uv_close(&fs_event,close_cb);
      uv_close(plVar8,close_cb);
      return;
    }
  }
  else {
    pcStack_2f8 = (code *)0x189110;
    timer_cb_cold_1();
  }
  pcStack_2f8 = run_test_fs_event_close_with_pending_event;
  timer_cb_cold_2();
  pcStack_310 = (code *)0x189129;
  pcStack_2f8 = (code *)plVar8;
  uVar4 = uv_default_loop();
  pcStack_310 = (code *)0x189138;
  create_dir("watch_dir");
  pcStack_310 = (code *)0x189144;
  create_file("watch_dir/file");
  pcStack_310 = (code *)0x189153;
  iVar2 = uv_fs_event_init(uVar4,&fs_event);
  lStack_300 = (long)iVar2;
  lStack_308 = 0;
  if (lStack_300 == 0) {
    iVar3 = 0;
    pcStack_310 = (code *)0x18918d;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir");
    lStack_300 = (long)iVar2;
    lStack_308 = 0;
    if (lStack_300 != 0) goto LAB_00189262;
    pcStack_310 = (code *)0x1891b7;
    touch_file("watch_dir/file");
    pcStack_310 = (code *)0x1891ca;
    uv_close(&fs_event,close_cb);
    pcStack_310 = (code *)0x1891d4;
    uv_run(uVar4,0);
    lStack_300 = 1;
    lStack_308 = (long)close_cb_called;
    if (lStack_308 != 1) goto LAB_0018926f;
    pcStack_310 = (code *)0x1891ff;
    remove("watch_dir/file");
    pcStack_310 = (code *)0x18920b;
    remove("watch_dir/");
    pcStack_310 = (code *)0x18921c;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_310 = (code *)0x189226;
    uv_run(uVar4,0);
    lStack_300 = 0;
    pcStack_310 = (code *)0x189237;
    iVar2 = uv_loop_close(uVar4);
    lStack_308 = (long)iVar2;
    if (lStack_300 == lStack_308) {
      pcStack_310 = (code *)0x18924d;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_310 = (code *)0x189262;
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_00189262:
    pcStack_310 = (code *)0x18926f;
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_0018926f:
    pcStack_310 = (code *)0x18927c;
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  pcStack_310 = run_test_fs_event_close_with_pending_delete_event;
  run_test_fs_event_close_with_pending_event_cold_4();
  pcStack_328 = (code *)0x189293;
  pcStack_310 = (code *)uVar4;
  uVar4 = uv_default_loop();
  pcStack_328 = (code *)0x1892a2;
  create_dir("watch_dir");
  pcStack_328 = (code *)0x1892ae;
  create_file("watch_dir/file");
  pcStack_328 = (code *)0x1892bd;
  iVar2 = uv_fs_event_init(uVar4,&fs_event);
  lStack_318 = (long)iVar2;
  lStack_320 = 0;
  if (lStack_318 == 0) {
    iVar3 = 0;
    pcStack_328 = (code *)0x1892f7;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir/file");
    lStack_318 = (long)iVar2;
    lStack_320 = 0;
    if (lStack_318 != 0) goto LAB_001893d2;
    pcStack_328 = (code *)0x189321;
    remove("watch_dir/file");
    pcStack_328 = (code *)0x18932b;
    uv_sleep(0x44c);
    pcStack_328 = (code *)0x189333;
    uv_update_time(uVar4);
    pcStack_328 = (code *)0x189346;
    uv_close(&fs_event,close_cb);
    pcStack_328 = (code *)0x189350;
    uv_run(uVar4,0);
    lStack_318 = 1;
    lStack_320 = (long)close_cb_called;
    if (lStack_320 != 1) goto LAB_001893df;
    pcStack_328 = (code *)0x18937b;
    remove("watch_dir/");
    pcStack_328 = (code *)0x18938c;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_328 = (code *)0x189396;
    uv_run(uVar4,0);
    lStack_318 = 0;
    pcStack_328 = (code *)0x1893a7;
    iVar2 = uv_loop_close(uVar4);
    lStack_320 = (long)iVar2;
    if (lStack_318 == lStack_320) {
      pcStack_328 = (code *)0x1893bd;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_328 = (code *)0x1893d2;
    run_test_fs_event_close_with_pending_delete_event_cold_1();
LAB_001893d2:
    pcStack_328 = (code *)0x1893df;
    run_test_fs_event_close_with_pending_delete_event_cold_2();
LAB_001893df:
    pcStack_328 = (code *)0x1893ec;
    run_test_fs_event_close_with_pending_delete_event_cold_3();
  }
  pcStack_328 = run_test_fs_event_close_in_callback;
  run_test_fs_event_close_with_pending_delete_event_cold_4();
  pcStack_340 = (code *)0x189403;
  pcStack_328 = (code *)uVar4;
  uVar4 = uv_default_loop();
  pcStack_340 = (code *)0x18940d;
  fs_event_unlink_files((uv_timer_t *)0x0);
  pcStack_340 = (code *)0x189419;
  create_dir("watch_dir");
  pcStack_340 = (code *)0x189428;
  iVar2 = uv_fs_event_init(uVar4,&fs_event);
  lStack_330 = (long)iVar2;
  lStack_338 = 0;
  if (lStack_330 == 0) {
    iVar3 = 0;
    pcStack_340 = (code *)0x189462;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir");
    lStack_330 = (long)iVar2;
    lStack_338 = 0;
    if (lStack_330 != 0) goto LAB_001895bf;
    pcStack_340 = (code *)0x18948f;
    iVar2 = uv_timer_init(uVar4,&timer);
    lStack_330 = (long)iVar2;
    lStack_338 = 0;
    if (lStack_330 != 0) goto LAB_001895cc;
    iVar3 = 0;
    pcStack_340 = (code *)0x1894c7;
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100);
    lStack_330 = (long)iVar2;
    lStack_338 = 0;
    if (lStack_330 != 0) goto LAB_001895d9;
    pcStack_340 = (code *)0x1894ef;
    uv_run(uVar4,0);
    pcStack_340 = (code *)0x189502;
    uv_close(&timer,close_cb);
    pcStack_340 = (code *)0x18950f;
    uv_run(uVar4,1);
    lStack_330 = 2;
    lStack_338 = (long)close_cb_called;
    if (lStack_338 != 2) goto LAB_001895e6;
    lStack_330 = 3;
    lStack_338 = (long)fs_event_cb_called;
    if (lStack_338 != 3) goto LAB_001895f3;
    pcStack_340 = (code *)0x18955c;
    fs_event_unlink_files((uv_timer_t *)0x0);
    pcStack_340 = (code *)0x189568;
    remove("watch_dir/");
    pcStack_340 = (code *)0x189579;
    uv_walk(uVar4,close_walk_cb,0);
    pcStack_340 = (code *)0x189583;
    uv_run(uVar4,0);
    lStack_330 = 0;
    pcStack_340 = (code *)0x189594;
    iVar2 = uv_loop_close(uVar4);
    lStack_338 = (long)iVar2;
    if (lStack_330 == lStack_338) {
      pcStack_340 = (code *)0x1895aa;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_340 = (code *)0x1895bf;
    run_test_fs_event_close_in_callback_cold_1();
LAB_001895bf:
    pcStack_340 = (code *)0x1895cc;
    run_test_fs_event_close_in_callback_cold_2();
LAB_001895cc:
    pcStack_340 = (code *)0x1895d9;
    run_test_fs_event_close_in_callback_cold_3();
LAB_001895d9:
    pcStack_340 = (code *)0x1895e6;
    run_test_fs_event_close_in_callback_cold_4();
LAB_001895e6:
    pcStack_340 = (code *)0x1895f3;
    run_test_fs_event_close_in_callback_cold_5();
LAB_001895f3:
    pcStack_340 = (code *)0x189600;
    run_test_fs_event_close_in_callback_cold_6();
  }
  pcStack_340 = fs_event_cb_close;
  run_test_fs_event_close_in_callback_cold_7();
  pcStack_340 = (code *)(long)iVar3;
  uStack_348 = 0;
  if (pcStack_340 == (code *)0x0) {
    pcStack_340 = (code *)(long)fs_event_cb_called;
    uStack_348 = 3;
    iVar3 = fs_event_cb_called;
    if ((long)pcStack_340 < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close();
        return;
      }
      return;
    }
  }
  else {
    pcStack_358 = (code *)0x189680;
    fs_event_cb_close_cold_1();
  }
  pcStack_358 = run_test_fs_event_start_and_close;
  fs_event_cb_close_cold_2();
  pcStack_358 = (code *)0x1e8b0e;
  uStack_360 = uVar4;
  uVar4 = uv_default_loop();
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(uVar4,auStack_3c8);
  uStack_440._16_8_ = SEXT48(iVar2);
  uStack_440.data = (uv_loop_t *)0x0;
  if (uStack_440._16_8_ == 0) {
    iVar3 = 0;
    iVar2 = uv_fs_event_start(auStack_3c8,fs_event_cb_dir,"watch_dir");
    uStack_440._16_8_ = SEXT48(iVar2);
    uStack_440.data = (uv_loop_t *)0x0;
    if (uStack_440._16_8_ != 0) goto LAB_00189840;
    iVar2 = uv_fs_event_init(uVar4,&uStack_440.type);
    uStack_440.data = (void *)(long)iVar2;
    uStack_440.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_440.data != (uv_loop_t *)0x0) goto LAB_0018984f;
    iVar3 = 0;
    iVar2 = uv_fs_event_start(&uStack_440.type,fs_event_cb_dir,"watch_dir");
    uStack_440.data = (void *)(long)iVar2;
    uStack_440.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_440.data != (uv_loop_t *)0x0) goto LAB_0018985e;
    uv_close(&uStack_440.type,close_cb);
    uv_close(auStack_3c8,close_cb);
    uv_run(uVar4,0);
    uStack_440.data = (uv_loop_t *)0x2;
    uStack_440.loop = (uv_loop_t *)(long)close_cb_called;
    if (uStack_440.loop != (uv_loop_t *)0x2) goto LAB_0018986d;
    remove("watch_dir/");
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    uStack_440.data = (uv_loop_t *)0x0;
    iVar2 = uv_loop_close(uVar4);
    uStack_440.loop = (uv_loop_t *)(long)iVar2;
    if ((uv_loop_t *)uStack_440.data == uStack_440.loop) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_00189840:
    run_test_fs_event_start_and_close_cold_2();
LAB_0018984f:
    run_test_fs_event_start_and_close_cold_3();
LAB_0018985e:
    run_test_fs_event_start_and_close_cold_4();
LAB_0018986d:
    run_test_fs_event_start_and_close_cold_5();
  }
  puVar9 = &uStack_440;
  __s1 = &uStack_440.loop;
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar9 == &fs_event) {
    if (iVar3 != 0) goto LAB_00189959;
    if (extraout_EDX != 2) goto LAB_00189968;
    iVar3 = strcmp((char *)__s1,"file1");
    if (iVar3 != 0) goto LAB_00189977;
    iVar3 = uv_fs_event_stop(&fs_event);
    if (iVar3 == 0) {
      uv_close(&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00189959:
    fs_event_cb_dir_cold_2();
LAB_00189968:
    fs_event_cb_dir_cold_3();
LAB_00189977:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  pcStack_8c0 = (code *)0x1899ab;
  uStack_490 = uVar4;
  uVar4 = uv_default_loop();
  pcStack_8c0 = (code *)0x1899ba;
  create_dir("watch_dir");
  pcStack_8c0 = (code *)0x1899c6;
  create_dir("watch_dir/subfolder");
  lVar7 = 0;
  sVar1 = sStack_8b0;
  do {
    sStack_8b0 = sVar1;
    pcStack_8c0 = (code *)0x1899e4;
    iVar3 = uv_fs_event_init(uVar4,&fs_event);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0;
    if (sStack_8a8 != 0) {
LAB_00189cd4:
      pcStack_8c0 = (code *)0x189ce3;
      run_test_fs_event_getpath_cold_1();
      goto LAB_00189ce3;
    }
    sStack_8a0 = 0x400;
    pcStack_8c0 = (code *)0x189a1b;
    iVar3 = uv_fs_event_getpath(&fs_event,acStack_898,&sStack_8a0);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0xffffffffffffffea;
    if (sStack_8a8 != 0xffffffffffffffea) {
LAB_00189cc5:
      pcStack_8c0 = (code *)0x189cd4;
      run_test_fs_event_getpath_cold_2();
      goto LAB_00189cd4;
    }
    __s = *(char **)((long)&DAT_0024dc50 + lVar7);
    pcStack_8c0 = (code *)0x189a5b;
    iVar3 = uv_fs_event_start(&fs_event,fail_cb,__s,0);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0;
    if (sStack_8a8 != 0) {
LAB_00189cb6:
      pcStack_8c0 = (code *)0x189cc5;
      run_test_fs_event_getpath_cold_3();
      goto LAB_00189cc5;
    }
    sStack_8a0 = 0;
    pcStack_8c0 = (code *)0x189a92;
    iVar3 = uv_fs_event_getpath(&fs_event,acStack_898,&sStack_8a0);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0xffffffffffffff97;
    if (sStack_8a8 != 0xffffffffffffff97) {
LAB_00189ca7:
      pcStack_8c0 = (code *)0x189cb6;
      run_test_fs_event_getpath_cold_4();
      goto LAB_00189cb6;
    }
    sStack_8a8 = sStack_8a0;
    sStack_8b0 = 0x400;
    if (0x3ff < (long)sStack_8a0) {
LAB_00189c98:
      pcStack_8c0 = (code *)0x189ca7;
      run_test_fs_event_getpath_cold_5();
      goto LAB_00189ca7;
    }
    pcStack_8c0 = (code *)0x189ae2;
    sStack_8b0 = strlen(__s);
    sStack_8b0 = sStack_8b0 + 1;
    if (sStack_8a8 != sStack_8b0) {
LAB_00189c89:
      pcStack_8c0 = (code *)0x189c98;
      run_test_fs_event_getpath_cold_6();
      goto LAB_00189c98;
    }
    pcStack_8c0 = (code *)0x189b08;
    iVar3 = uv_fs_event_getpath(&fs_event,acStack_898,&sStack_8a0);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0;
    if (sStack_8a8 != 0) {
LAB_00189c7a:
      pcStack_8c0 = (code *)0x189c89;
      run_test_fs_event_getpath_cold_7();
      goto LAB_00189c89;
    }
    sStack_8a8 = sStack_8a0;
    pcStack_8c0 = (code *)0x189b3a;
    sStack_8b0 = strlen(__s);
    if (sStack_8a8 != sStack_8b0) {
LAB_00189c6b:
      pcStack_8c0 = (code *)0x189c7a;
      run_test_fs_event_getpath_cold_8();
      goto LAB_00189c7a;
    }
    pcStack_8c0 = (code *)0x189b5a;
    iVar3 = strcmp(acStack_898,__s);
    if (iVar3 != 0) {
LAB_00189c66:
      pcStack_8c0 = (code *)0x189c6b;
      run_test_fs_event_getpath_cold_9();
      goto LAB_00189c6b;
    }
    pcStack_8c0 = (code *)0x189b6a;
    iVar3 = uv_fs_event_stop(&fs_event);
    sStack_8a8 = (size_t)iVar3;
    sStack_8b0 = 0;
    if (sStack_8a8 != 0) {
LAB_00189c57:
      pcStack_8c0 = (code *)0x189c66;
      run_test_fs_event_getpath_cold_10();
      goto LAB_00189c66;
    }
    pcStack_8c0 = (code *)0x189b99;
    uv_close(&fs_event,close_cb);
    pcStack_8c0 = (code *)0x189ba3;
    uv_run(uVar4,0);
    sStack_8a8 = 1;
    sStack_8b0 = (size_t)close_cb_called;
    if (sStack_8b0 != 1) {
      pcStack_8c0 = (code *)0x189c57;
      run_test_fs_event_getpath_cold_11();
      goto LAB_00189c57;
    }
    close_cb_called = 0;
    lVar7 = lVar7 + 8;
    sVar1 = 1;
  } while (lVar7 != 0x28);
  pcStack_8c0 = (code *)0x189bec;
  remove("watch_dir/");
  pcStack_8c0 = (code *)0x189bfd;
  uv_walk(uVar4,close_walk_cb,0);
  pcStack_8c0 = (code *)0x189c07;
  uv_run(uVar4,0);
  sStack_8a8 = 0;
  pcStack_8c0 = (code *)0x189c18;
  iVar3 = uv_loop_close(uVar4);
  sStack_8b0 = (size_t)iVar3;
  if (sStack_8a8 == sStack_8b0) {
    pcStack_8c0 = (code *)0x189c34;
    uv_library_shutdown();
    return;
  }
LAB_00189ce3:
  pcStack_8c0 = run_test_fs_event_error_reporting;
  run_test_fs_event_getpath_cold_12();
  pcStack_8d8 = (code *)0x189cfc;
  pcStack_8c0 = (code *)uVar4;
  uVar4 = uv_default_loop();
  pcStack_8d8 = (code *)0x189d10;
  uv_walk(uVar4,close_walk_cb,0);
  pcStack_8d8 = (code *)0x189d1a;
  uv_run(uVar4,0);
  lStack_8c8 = 0;
  pcStack_8d8 = (code *)0x189d28;
  uVar5 = uv_default_loop();
  pcStack_8d8 = (code *)0x189d30;
  iVar3 = uv_loop_close(uVar5);
  lStack_8d0 = (long)iVar3;
  if (lStack_8c8 == lStack_8d0) {
    pcStack_8d8 = (code *)0x189d46;
    uv_library_shutdown();
    return;
  }
  pcStack_8d8 = run_test_fs_event_watch_invalid_path;
  run_test_fs_event_error_reporting_cold_1();
  puStack_8f0 = (uv_fs_event_t *)0x189d65;
  pcStack_8d8 = (code *)uVar4;
  uVar4 = uv_default_loop();
  puStack_8f0 = (uv_fs_event_t *)0x189d77;
  iVar3 = uv_fs_event_init(uVar4,&fs_event);
  lStack_8e0 = (long)iVar3;
  lStack_8e8 = 0;
  if (lStack_8e0 == 0) {
    puStack_8f0 = (uv_fs_event_t *)0x189db1;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar3 == 0) goto LAB_00189e84;
    puStack_8f0 = (uv_fs_event_t *)0x189dc5;
    iVar3 = uv_is_active(&fs_event);
    lStack_8e0 = (long)iVar3;
    lStack_8e8 = 0;
    if (lStack_8e0 != 0) goto LAB_00189e89;
    puStack_8f0 = (uv_fs_event_t *)0x189dff;
    iVar3 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar3 == 0) goto LAB_00189e96;
    puStack_8f0 = (uv_fs_event_t *)0x189e13;
    iVar3 = uv_is_active(&fs_event);
    lStack_8e0 = (long)iVar3;
    lStack_8e8 = 0;
    if (lStack_8e0 != 0) goto LAB_00189e9b;
    puStack_8f0 = (uv_fs_event_t *)0x189e3e;
    uv_walk(uVar4,close_walk_cb,0);
    puStack_8f0 = (uv_fs_event_t *)0x189e48;
    uv_run(uVar4,0);
    lStack_8e0 = 0;
    puStack_8f0 = (uv_fs_event_t *)0x189e59;
    iVar3 = uv_loop_close(uVar4);
    lStack_8e8 = (long)iVar3;
    if (lStack_8e0 == lStack_8e8) {
      puStack_8f0 = (uv_fs_event_t *)0x189e6f;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_8f0 = (uv_fs_event_t *)0x189e84;
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00189e84:
    puStack_8f0 = (uv_fs_event_t *)0x189e89;
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00189e89:
    puStack_8f0 = (uv_fs_event_t *)0x189e96;
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00189e96:
    puStack_8f0 = (uv_fs_event_t *)0x189e9b;
    run_test_fs_event_watch_invalid_path_cold_5();
LAB_00189e9b:
    puStack_8f0 = (uv_fs_event_t *)0x189ea8;
    run_test_fs_event_watch_invalid_path_cold_3();
  }
  puStack_8f0 = (uv_fs_event_t *)run_test_fs_event_stop_in_cb;
  run_test_fs_event_watch_invalid_path_cold_4();
  puStack_8f0 = &fs_event;
  builtin_strncpy(acStack_9f0,"fs_event_stop_in_cb.txt",0x18);
  uStack_8f8 = uVar4;
  remove(acStack_9f0);
  create_file(acStack_9f0);
  uVar4 = uv_default_loop();
  iVar3 = uv_fs_event_init(uVar4,auStack_960);
  apcStack_9d8[0] = (char *)(long)iVar3;
  if (apcStack_9d8[0] == (char *)0x0) {
    iVar3 = uv_fs_event_start(auStack_960,fs_event_cb_stop,acStack_9f0,0);
    apcStack_9d8[0] = (char *)(long)iVar3;
    if (apcStack_9d8[0] != (char *)0x0) goto LAB_0018a156;
    apcStack_9d8[0] = acStack_9f0;
    uVar4 = uv_default_loop();
    iVar3 = uv_timer_init(uVar4,apcStack_9d8);
    if (iVar3 != 0) goto LAB_0018a163;
    iVar3 = uv_timer_start(apcStack_9d8,timer_cb_touch,100,0);
    if (iVar3 != 0) goto LAB_0018a170;
    if (fs_event_cb_stop_calls != 0) goto LAB_0018a17d;
    if (timer_cb_touch_called != 0) goto LAB_0018a18a;
    uVar4 = uv_default_loop();
    iVar3 = uv_run(uVar4,0);
    if (iVar3 != 0) goto LAB_0018a197;
    if (fs_event_cb_stop_calls != 1) goto LAB_0018a1a4;
    if (timer_cb_touch_called != 1) goto LAB_0018a1b1;
    uv_close(auStack_960,0);
    uVar4 = uv_default_loop();
    iVar3 = uv_run(uVar4,0);
    if (iVar3 != 0) goto LAB_0018a1be;
    if (fs_event_cb_stop_calls == 1) {
      remove(acStack_9f0);
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar3 = uv_loop_close(uVar4);
      if (iVar3 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0018a1d8;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_0018a156:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_0018a163:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_0018a170:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_0018a17d:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_0018a18a:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_0018a197:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_0018a1a4:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_0018a1b1:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_0018a1be:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_0018a1d8:
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop();
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return;
}

Assistant:

static void touch_file(const char* name) {
  int r;
  uv_os_fd_t file;
  uv_fs_t req;
  uv_buf_t buf;

  r = uv_fs_open(NULL, &req, name, UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  buf = uv_buf_init("foo", 4);
  r = uv_fs_write(NULL, &req, file, &buf, 1, -1, NULL);
  ASSERT_GE(r, 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
}